

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_device_memory_device.cpp
# Opt level: O0

void device_cleanup(void)

{
  embree::TutorialData_Destructor((TutorialData *)0x1308ad);
  return;
}

Assistant:

void device_cleanup ()
{
  TutorialData_Destructor(&data);
}